

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_utils.c
# Opt level: O0

void save_extra_coding_context(AV1_COMP *cpi)

{
  long *in_RDI;
  AV1_COMMON *cm;
  CODING_CONTEXT *cc;
  
  memcpy(in_RDI + 0xc055,in_RDI + 0x832e,0x30);
  memcpy(in_RDI + 0xc05b,in_RDI + 0x8368,0x108);
  memcpy(in_RDI + 0xc096,in_RDI + 0xc0ee,0x140);
  memcpy(in_RDI + 0xc0be,(void *)(*in_RDI + 0x12360),0x4c);
  return;
}

Assistant:

static void save_extra_coding_context(AV1_COMP *cpi) {
  CODING_CONTEXT *const cc = &cpi->coding_context;
  AV1_COMMON *cm = &cpi->common;

  cc->lf = cm->lf;
  cc->cdef_info = cm->cdef_info;
  cc->rc = cpi->rc;
  cc->mv_stats = cpi->ppi->mv_stats;
}